

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

Approx * __thiscall
doctest::Approx::operator()(Approx *__return_storage_ptr__,Approx *this,double value)

{
  __return_storage_ptr__->m_epsilon = 1.1920928955078125e-05;
  __return_storage_ptr__->m_scale = 1.0;
  __return_storage_ptr__->m_value = value;
  __return_storage_ptr__->m_epsilon = this->m_epsilon;
  __return_storage_ptr__->m_scale = this->m_scale;
  return __return_storage_ptr__;
}

Assistant:

Approx Approx::operator()(double value) const {
    Approx approx(value);
    approx.epsilon(m_epsilon);
    approx.scale(m_scale);
    return approx;
}